

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

_Bool nni_aio_sys_drain(void)

{
  nni_aio_expire_q *mtx;
  int iVar1;
  _Bool _Var2;
  long lVar3;
  
  if (nni_aio_expire_q_cnt < 1) {
    _Var2 = false;
  }
  else {
    lVar3 = 0;
    _Var2 = false;
    do {
      mtx = nni_aio_expire_q_list[lVar3];
      if (mtx != (nni_aio_expire_q *)0x0) {
        nni_mtx_lock(&mtx->eq_mtx);
        mtx->eq_stop = true;
        nni_cv_wake(&mtx->eq_cv);
        iVar1 = nni_list_empty(&mtx->eq_list);
        if (iVar1 == 0) {
          do {
            nni_cv_wait(&mtx->eq_cv);
            iVar1 = nni_list_empty(&mtx->eq_list);
          } while (iVar1 == 0);
          _Var2 = true;
        }
        nni_mtx_unlock(&mtx->eq_mtx);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < nni_aio_expire_q_cnt);
  }
  return _Var2;
}

Assistant:

bool
nni_aio_sys_drain(void)
{
	bool result = false;
	for (int i = 0; i < nni_aio_expire_q_cnt; i++) {
		if (nni_aio_expire_q_stop(nni_aio_expire_q_list[i])) {
			result = true;
		}
	}
	return (result);
}